

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O1

bool __thiscall
iDynTree::ModelLoader::loadReducedModelFromFile
          (ModelLoader *this,string *filename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredJoints,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *removedJointPositions,string filetype,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageDirs)

{
  _Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false> this_00;
  bool bVar1;
  char cVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  Model _modelReduced;
  Model _modelFull;
  Model aMStack_288 [304];
  Model local_158 [304];
  
  bVar1 = loadModelFromFile(this,filename,(string *)consideredJoints,in_R9);
  if (bVar1) {
    iDynTree::Model::Model
              (local_158,
               &((this->m_pimpl)._M_t.
                 super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                 .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>.
                _M_head_impl)->m_model);
    iDynTree::Model::Model(aMStack_288);
    iDynTree::Model::setPackageDirs((vector *)aMStack_288);
    cVar2 = iDynTree::createReducedModel
                      (local_158,(vector *)consideredJoints,aMStack_288,
                       (unordered_map *)removedJointPositions);
    if (cVar2 != '\0') {
      this_00._M_head_impl =
           (this->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
           .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>._M_head_impl;
      iDynTree::Model::operator=(&(this_00._M_head_impl)->m_model,aMStack_288);
      *(Model *)&(this_00._M_head_impl)->m_isModelValid = (Model)0x1;
    }
    iDynTree::Model::~Model(aMStack_288);
    iDynTree::Model::~Model(local_158);
  }
  else {
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool ModelLoader::loadReducedModelFromFile(const std::string filename,
                                               const std::vector< std::string >& consideredJoints,
                                               const std::unordered_map<std::string, double>& removedJointPositions,
                                               const std::string filetype,
                                               const std::vector<std::string>& packageDirs /*= {}*/)
    {
        bool parsingCorrect = loadModelFromFile(filename, filetype, packageDirs);
        if (!parsingCorrect) return false;
        Model _modelFull = m_pimpl->m_model, _modelReduced;
        _modelReduced.setPackageDirs(packageDirs);

        parsingCorrect = createReducedModel(_modelFull,consideredJoints,_modelReduced,removedJointPositions);

        if (!parsingCorrect)
        {
            return false;
        }

        return m_pimpl->setModel(_modelReduced);
    }